

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O2

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
::~CompositeCodec(CompositeCodec<FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
                  *this)

{
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001bad40;
  SIMDSimplePFor<FastPForLib::Simple8b<true>_>::~SIMDSimplePFor(&this->codec1);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}